

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

uint32_t __thiscall
TS_program_map_section::serialize
          (TS_program_map_section *this,uint8_t *buffer,int max_buf_size,bool blurayMode,
          bool hdmvDescriptors)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  uint8_t *buffer_00;
  uint8_t *puVar9;
  uint8_t *puVar10;
  reference __in;
  type *ptVar11;
  ostream *this_00;
  uint32_t *crcPtr;
  uint32_t crc;
  int k;
  int j;
  uint beforeCount;
  uint16_t *esInfoLen;
  type *si;
  type *pid;
  _Self local_78;
  iterator __end1;
  iterator __begin1;
  PIDListMap *__range1;
  uint beforeCount2;
  uint16_t *LengthPos2;
  uint beforeCount1;
  uint16_t *LengthPos1;
  BitStreamWriter bitWriter;
  bool hdmvDescriptors_local;
  bool blurayMode_local;
  int max_buf_size_local;
  uint8_t *buffer_local;
  TS_program_map_section *this_local;
  
  *buffer = '\0';
  buffer_00 = buffer + 1;
  bitWriter.m_curVal._2_1_ = hdmvDescriptors;
  bitWriter.m_curVal._3_1_ = blurayMode;
  bitWriter.m_bitWrited = max_buf_size;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)&LengthPos1);
  BitStreamWriter::setBuffer
            ((BitStreamWriter *)&LengthPos1,buffer_00,buffer_00 + (int)bitWriter.m_bitWrited);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,2);
  puVar9 = BitStream::getBuffer((BitStream *)&LengthPos1);
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,2,2);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,2,3);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xc,0);
  iVar4 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0x10,(uint)this->program_number);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,2,3);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,5,0);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,1,1);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0x10,0);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,3,7);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xd,this->pcr_pid);
  puVar10 = BitStream::getBuffer((BitStream *)&LengthPos1);
  iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,4,0xf);
  BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xc,0);
  iVar6 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  if ((bitWriter.m_curVal._2_1_ & 1) != 0) {
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,5);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,4);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0x20,0x48444d56);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,0x88);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,4);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0x20,0xffffcfc);
  }
  if (this->casPID != 0) {
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,9);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,4);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0x10,this->casID);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0x10,this->casPID);
  }
  iVar7 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  uVar2 = my_ntohs(((short)(iVar7 / 8) + -0x1000) - (short)(iVar6 / 8));
  *(uint16_t *)(puVar10 + iVar5 / 8) = uVar2;
  if (this->video_pid != 0) {
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,this->video_type);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,3,7);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xd,this->video_pid);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,4,0xf);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xc,0);
  }
  if (this->audio_pid != 0) {
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,this->audio_type);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,3,7);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xd,this->audio_pid);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,4,0xf);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xc,0);
  }
  if (this->sub_pid != 0) {
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,6);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,3,7);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xd,this->sub_pid);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,4,0xf);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xc,0);
  }
  __end1 = std::
           map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
           ::begin(&this->pidList);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
       ::end(&this->pidList);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_78);
    if (!bVar1) break;
    __in = std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator*(&__end1);
    std::get<0ul,int_const,PMTStreamInfo>(__in);
    ptVar11 = std::get<1ul,int_const,PMTStreamInfo>(__in);
    if ((ptVar11->m_streamType == SUB_PGS) && ((bitWriter.m_curVal._2_1_ & 1) == 0)) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "Warning: PGS might not work without HDMV descriptors.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,ptVar11->m_streamType);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,3,7);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xd,ptVar11->m_pid);
    puVar10 = BitStream::getBuffer((BitStream *)&LengthPos1);
    iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,4,0xf);
    BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,0xc,0);
    iVar6 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
    for (crc = 0; (int)crc < ptVar11->m_esInfoLen; crc = crc + 1) {
      BitStreamWriter::putBits
                ((BitStreamWriter *)&LengthPos1,8,(uint)ptVar11->m_esInfoData[(int)crc]);
    }
    if ((ptVar11->m_lang[0] != '\0') && ((bitWriter.m_curVal._3_1_ & 1) == 0)) {
      BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,10);
      BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,4);
      for (crcPtr._4_4_ = 0; crcPtr._4_4_ < 3; crcPtr._4_4_ = crcPtr._4_4_ + 1) {
        BitStreamWriter::putBits
                  ((BitStreamWriter *)&LengthPos1,8,(int)ptVar11->m_lang[crcPtr._4_4_]);
      }
      BitStreamWriter::putBits((BitStreamWriter *)&LengthPos1,8,0);
    }
    iVar7 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
    uVar2 = my_ntohs(((short)(iVar7 / 8) + -0x1000) - (short)(iVar6 / 8));
    *(uint16_t *)(puVar10 + iVar5 / 8) = uVar2;
    std::_Rb_tree_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator++(&__end1);
  }
  iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  uVar2 = my_ntohs(((short)(iVar5 / 8) - (short)(iVar4 / 8)) + 0xb004);
  *(uint16_t *)(puVar9 + iVar3 / 8) = uVar2;
  BitStreamWriter::flushBits((BitStreamWriter *)&LengthPos1);
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  uVar8 = calculateCRC32(buffer_00,(long)(iVar3 / 8),0);
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  uVar8 = my_ntohl(uVar8);
  *(uint32_t *)(buffer_00 + iVar3 / 8) = uVar8;
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)&LengthPos1);
  return iVar3 / 8 + 5;
}

Assistant:

uint32_t TS_program_map_section::serialize(uint8_t* buffer, const int max_buf_size, const bool blurayMode,
                                           const bool hdmvDescriptors)
{
    buffer[0] = 0;
    buffer++;
    BitStreamWriter bitWriter{};
    bitWriter.setBuffer(buffer, buffer + max_buf_size);
    bitWriter.putBits(8, 2);  // table id

    const auto LengthPos1 = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
    bitWriter.putBits(2, 2);   // indicator
    bitWriter.putBits(2, 3);   // reserved
    bitWriter.putBits(12, 0);  // length
    const unsigned beforeCount1 = bitWriter.getBitsCount() / 8;

    bitWriter.putBits(16, program_number);
    bitWriter.putBits(2, 3);         // reserved
    bitWriter.putBits(5, 0);         // version_number
    bitWriter.putBits(1, 1);         // current next indicator
    bitWriter.putBits(16, 0);        // section_number and last_section_number
    bitWriter.putBits(3, 7);         // reserved
    bitWriter.putBits(13, pcr_pid);  // reserved

    const auto LengthPos2 = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
    bitWriter.putBits(4, 15);  // reserved
    bitWriter.putBits(12, 0);  // program info len
    const unsigned beforeCount2 = bitWriter.getBitsCount() / 8;

    if (hdmvDescriptors)
    {
        // put 'HDMV' registration descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::HDMV));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(32, 0x48444d56);

        // put DTCP descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::COPY_CONTROL));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(32, 0x0ffffcfc);
    }

    if (casPID)
    {
        // put CAS descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::CAS));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(16, casID);
        bitWriter.putBits(16, casPID);
    }
    *LengthPos2 = my_htons(static_cast<uint16_t>(0xf000 + bitWriter.getBitsCount() / 8 - beforeCount2));

    if (video_pid)
    {
        bitWriter.putBits(8, video_type);
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, video_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    if (audio_pid)
    {
        bitWriter.putBits(8, audio_type);
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, audio_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    if (sub_pid)
    {
        bitWriter.putBits(8, static_cast<uint8_t>(StreamType::SUB_DVB));
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, sub_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    for (const auto& [pid, si] : pidList)
    {
        if (si.m_streamType == StreamType::SUB_PGS && !hdmvDescriptors)
            LTRACE(LT_WARN, 2, "Warning: PGS might not work without HDMV descriptors.");

        bitWriter.putBits(8, static_cast<int>(si.m_streamType));
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, si.m_pid);

        const auto esInfoLen = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
        const unsigned beforeCount = bitWriter.getBitsCount() / 8;

        for (int j = 0; j < si.m_esInfoLen; j++) bitWriter.putBits(8, si.m_esInfoData[j]);  // es_info_len

        if (*si.m_lang && !blurayMode)
        {
            bitWriter.putBits(8, static_cast<unsigned>(TSDescriptorTag::LANG));  // lang descriptor ID
            bitWriter.putBits(8, 4);                                             // lang descriptor len
            for (int k = 0; k < 3; k++) bitWriter.putBits(8, si.m_lang[k]);      // lang code[i]
            bitWriter.putBits(8, 0);
        }
        *esInfoLen = my_htons(static_cast<uint16_t>(0xf000 + bitWriter.getBitsCount() / 8 - beforeCount));
    }
    *LengthPos1 = my_htons(static_cast<uint16_t>(0xb000 + bitWriter.getBitsCount() / 8 - beforeCount1 + 4));
    bitWriter.flushBits();

    const uint32_t crc = calculateCRC32(buffer, bitWriter.getBitsCount() / 8);

    const auto crcPtr = reinterpret_cast<uint32_t*>(buffer + bitWriter.getBitsCount() / 8);
    *crcPtr = my_htonl(crc);

    return bitWriter.getBitsCount() / 8 + 5;
}